

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# converttif.c
# Opt level: O2

void tif_13uto32s(OPJ_BYTE *pSrc,OPJ_INT32 *pDst,OPJ_SIZE_T length)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  byte bVar6;
  byte bVar7;
  byte bVar8;
  byte bVar9;
  byte bVar10;
  byte bVar11;
  byte bVar12;
  int iVar13;
  uint uVar14;
  uint uVar15;
  int iVar16;
  int iVar17;
  uint uVar18;
  ulong uVar19;
  byte *pbVar20;
  
  for (uVar19 = 0; uVar19 < (length & 0xfffffffffffffff8); uVar19 = uVar19 + 8) {
    bVar1 = pSrc[1];
    bVar2 = pSrc[2];
    bVar3 = pSrc[3];
    bVar4 = pSrc[4];
    bVar5 = pSrc[5];
    bVar6 = pSrc[6];
    bVar7 = pSrc[7];
    bVar8 = pSrc[8];
    bVar9 = pSrc[9];
    bVar10 = pSrc[10];
    bVar11 = pSrc[0xb];
    bVar12 = pSrc[0xc];
    pDst[uVar19] = (uint)(bVar1 >> 3) | (uint)*pSrc << 5;
    pDst[uVar19 + 1] = (uint)(bVar3 >> 6) | (bVar1 & 7) * 0x400 + (uint)bVar2 * 4;
    pDst[uVar19 + 2] = (uint)(bVar4 >> 1) | (bVar3 & 0x3f) << 7;
    pDst[uVar19 + 3] = (uint)(bVar6 >> 4) | (uint)bVar5 << 4 | (bVar4 & 1) << 0xc;
    pDst[uVar19 + 4] = (uint)(bVar8 >> 7) | (bVar6 & 0xf) * 0x200 + (uint)bVar7 * 2;
    pDst[uVar19 + 5] = (uint)(bVar9 >> 2) | (bVar8 & 0x7f) << 6;
    pDst[uVar19 + 6] = (uint)(bVar11 >> 5) | (bVar9 & 3) * 0x800 + (uint)bVar10 * 8;
    pDst[uVar19 + 7] = (bVar11 & 0x1f) << 8 | (uint)bVar12;
    pSrc = pSrc + 0xd;
  }
  if ((length & 7) != 0) {
    bVar1 = pSrc[1];
    pDst[uVar19] = (uint)(bVar1 >> 3) | (uint)*pSrc << 5;
    uVar18 = (uint)(length & 7);
    if (uVar18 != 1) {
      pbVar20 = pSrc + 2;
      uVar15 = 0;
      iVar13 = 3;
      iVar17 = 0xd;
      while( true ) {
        uVar14 = (uint)bVar1;
        iVar16 = iVar17 - iVar13;
        if (iVar16 == 0 || iVar17 < iVar13) break;
        uVar15 = (uVar15 | uVar14 & ~(-1 << (sbyte)iVar13)) << ((byte)iVar16 & 0x1f);
        bVar1 = *pbVar20;
        pbVar20 = pbVar20 + 1;
        iVar13 = 8;
        iVar17 = iVar16;
      }
      iVar13 = iVar13 - iVar17;
      pDst[uVar19 + 1] =
           ~(-1 << ((byte)iVar17 & 0x1f)) & (uint)(bVar1 >> ((byte)iVar13 & 0x1f)) | uVar15;
      if (2 < uVar18) {
        uVar15 = 0;
        iVar16 = 0xd;
        iVar17 = 0xd;
        if (iVar13 != 0) goto LAB_001108ed;
        while( true ) {
          iVar16 = iVar17;
          uVar14 = (uint)*pbVar20;
          pbVar20 = pbVar20 + 1;
          iVar13 = 8;
LAB_001108ed:
          iVar17 = iVar16 - iVar13;
          if (iVar17 == 0 || iVar16 < iVar13) break;
          uVar15 = (uVar15 | uVar14 & ~(-1 << ((byte)iVar13 & 0x1f))) << ((byte)iVar17 & 0x1f);
        }
        iVar13 = iVar13 - iVar16;
        pDst[uVar19 + 2] = ~(-1 << ((byte)iVar16 & 0x1f)) & uVar14 >> ((byte)iVar13 & 0x1f) | uVar15
        ;
        if (uVar18 != 3) {
          uVar15 = 0;
          iVar16 = 0xd;
          iVar17 = 0xd;
          if (iVar13 != 0) goto LAB_00110952;
          while( true ) {
            iVar16 = iVar17;
            uVar14 = (uint)*pbVar20;
            pbVar20 = pbVar20 + 1;
            iVar13 = 8;
LAB_00110952:
            iVar17 = iVar16 - iVar13;
            if (iVar17 == 0 || iVar16 < iVar13) break;
            uVar15 = (uVar15 | uVar14 & ~(-1 << ((byte)iVar13 & 0x1f))) << ((byte)iVar17 & 0x1f);
          }
          iVar13 = iVar13 - iVar16;
          pDst[uVar19 + 3] =
               ~(-1 << ((byte)iVar16 & 0x1f)) & uVar14 >> ((byte)iVar13 & 0x1f) | uVar15;
          if (4 < uVar18) {
            uVar15 = 0;
            iVar16 = 0xd;
            iVar17 = 0xd;
            if (iVar13 != 0) goto LAB_001109b7;
            while( true ) {
              iVar16 = iVar17;
              uVar14 = (uint)*pbVar20;
              pbVar20 = pbVar20 + 1;
              iVar13 = 8;
LAB_001109b7:
              iVar17 = iVar16 - iVar13;
              if (iVar17 == 0 || iVar16 < iVar13) break;
              uVar15 = (uVar15 | uVar14 & ~(-1 << ((byte)iVar13 & 0x1f))) << ((byte)iVar17 & 0x1f);
            }
            iVar13 = iVar13 - iVar16;
            pDst[uVar19 + 4] =
                 ~(-1 << ((byte)iVar16 & 0x1f)) & uVar14 >> ((byte)iVar13 & 0x1f) | uVar15;
            if (uVar18 != 5) {
              uVar15 = 0;
              iVar16 = 0xd;
              iVar17 = 0xd;
              if (iVar13 != 0) goto LAB_00110a1c;
              while( true ) {
                iVar16 = iVar17;
                uVar14 = (uint)*pbVar20;
                pbVar20 = pbVar20 + 1;
                iVar13 = 8;
LAB_00110a1c:
                iVar17 = iVar16 - iVar13;
                if (iVar17 == 0 || iVar16 < iVar13) break;
                uVar15 = (uVar15 | uVar14 & ~(-1 << ((byte)iVar13 & 0x1f))) << ((byte)iVar17 & 0x1f)
                ;
              }
              iVar13 = iVar13 - iVar16;
              pDst[uVar19 + 5] =
                   ~(-1 << ((byte)iVar16 & 0x1f)) & uVar14 >> ((byte)iVar13 & 0x1f) | uVar15;
              if (uVar18 == 7) {
                uVar18 = 0;
                iVar16 = 0xd;
                iVar17 = 0xd;
                if (iVar13 != 0) goto LAB_00110a7d;
                while( true ) {
                  iVar16 = iVar17;
                  uVar14 = (uint)*pbVar20;
                  pbVar20 = pbVar20 + 1;
                  iVar13 = 8;
LAB_00110a7d:
                  iVar17 = iVar16 - iVar13;
                  if (iVar17 == 0 || iVar16 < iVar13) break;
                  uVar18 = (uVar18 | uVar14 & ~(-1 << ((byte)iVar13 & 0x1f))) <<
                           ((byte)iVar17 & 0x1f);
                }
                pDst[uVar19 + 6] =
                     ~(-1 << ((byte)iVar16 & 0x1f)) & uVar14 >> ((byte)iVar13 - (byte)iVar16 & 0x1f)
                     | uVar18;
              }
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

static void tif_13uto32s(const OPJ_BYTE* pSrc, OPJ_INT32* pDst,
                         OPJ_SIZE_T length)
{
    OPJ_SIZE_T i;
    for (i = 0; i < (length & ~(OPJ_SIZE_T)7U); i += 8U) {
        OPJ_UINT32 val0 = *pSrc++;
        OPJ_UINT32 val1 = *pSrc++;
        OPJ_UINT32 val2 = *pSrc++;
        OPJ_UINT32 val3 = *pSrc++;
        OPJ_UINT32 val4 = *pSrc++;
        OPJ_UINT32 val5 = *pSrc++;
        OPJ_UINT32 val6 = *pSrc++;
        OPJ_UINT32 val7 = *pSrc++;
        OPJ_UINT32 val8 = *pSrc++;
        OPJ_UINT32 val9 = *pSrc++;
        OPJ_UINT32 val10 = *pSrc++;
        OPJ_UINT32 val11 = *pSrc++;
        OPJ_UINT32 val12 = *pSrc++;

        pDst[i + 0] = (OPJ_INT32)((val0 << 5) | (val1 >> 3));
        pDst[i + 1] = (OPJ_INT32)(((val1 & 0x7U) << 10) | (val2 << 2) | (val3 >> 6));
        pDst[i + 2] = (OPJ_INT32)(((val3 & 0x3FU) << 7) | (val4 >> 1));
        pDst[i + 3] = (OPJ_INT32)(((val4 & 0x1U) << 12) | (val5 << 4) | (val6 >> 4));
        pDst[i + 4] = (OPJ_INT32)(((val6 & 0xFU) << 9) | (val7 << 1) | (val8 >> 7));
        pDst[i + 5] = (OPJ_INT32)(((val8 & 0x7FU) << 6) | (val9 >> 2));
        pDst[i + 6] = (OPJ_INT32)(((val9 & 0x3U) << 11) | (val10 << 3) | (val11 >> 5));
        pDst[i + 7] = (OPJ_INT32)(((val11 & 0x1FU) << 8) | (val12));

    }
    if (length & 7U) {
        unsigned int val;
        int available = 0;

        length = length & 7U;

        GETBITS(pDst[i + 0], 13)

        if (length > 1U) {
            GETBITS(pDst[i + 1], 13)
            if (length > 2U) {
                GETBITS(pDst[i + 2], 13)
                if (length > 3U) {
                    GETBITS(pDst[i + 3], 13)
                    if (length > 4U) {
                        GETBITS(pDst[i + 4], 13)
                        if (length > 5U) {
                            GETBITS(pDst[i + 5], 13)
                            if (length > 6U) {
                                GETBITS(pDst[i + 6], 13)
                            }
                        }
                    }
                }
            }
        }
    }
}